

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_crossing_analysis.cc
# Opt level: O3

bool __thiscall
sptk::ZeroCrossingAnalysis::Run
          (ZeroCrossingAnalysis *this,vector<double,_std::allocator<double>_> *signals,
          int *num_zero_crossing,Buffer *buffer)

{
  int iVar1;
  double *pdVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  if (((this->is_valid_ == true) && (buffer != (Buffer *)0x0)) && (num_zero_crossing != (int *)0x0))
  {
    pdVar2 = (signals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)(signals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar2;
    iVar1 = this->frame_length_;
    if (lVar4 >> 3 == (long)iVar1) {
      if (buffer->is_first_frame_ == false) {
        dVar7 = buffer->latest_signal_;
        dVar6 = *pdVar2;
      }
      else {
        dVar6 = *pdVar2;
        buffer->latest_signal_ = dVar6;
        buffer->is_first_frame_ = false;
        dVar7 = dVar6;
      }
      if (((0.0 <= dVar7) && (dVar6 < 0.0)) || (iVar3 = 0, 0.0 <= dVar6 && dVar7 < 0.0)) {
        iVar3 = 1;
      }
      if (1 < iVar1) {
        lVar5 = 1;
        do {
          iVar3 = iVar3 + (-(uint)(0.0 <= pdVar2[lVar5 + -1] && pdVar2[lVar5] < 0.0 ||
                                  pdVar2[lVar5 + -1] < 0.0 && 0.0 <= pdVar2[lVar5]) & 1);
          lVar5 = lVar5 + 1;
        } while (iVar1 != lVar5);
      }
      buffer->latest_signal_ = *(double *)((long)pdVar2 + lVar4 + -8);
      *num_zero_crossing = iVar3;
      return true;
    }
  }
  return false;
}

Assistant:

bool ZeroCrossingAnalysis::Run(const std::vector<double>& signals,
                               int* num_zero_crossing,
                               ZeroCrossingAnalysis::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ || signals.size() != static_cast<std::size_t>(frame_length_) ||
      NULL == num_zero_crossing || NULL == buffer) {
    return false;
  }

  const double* x(&(signals[0]));

  if (buffer->is_first_frame_) {
    buffer->latest_signal_ = x[0];
    buffer->is_first_frame_ = false;
  }

  int count(0);
  if (IsCrossed(buffer->latest_signal_, x[0])) {
    ++count;
  }
  for (int i(1); i < frame_length_; ++i) {
    if (IsCrossed(x[i - 1], x[i])) {
      ++count;
    }
  }

  buffer->latest_signal_ = x[frame_length_ - 1];
  *num_zero_crossing = count;

  return true;
}